

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O0

T5_d * __thiscall di::Context::get<T5_d>(Context *this)

{
  runtime_error *this_00;
  allocator local_59;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  CtxItem *local_18;
  CtxItem *item;
  Context *this_local;
  
  item = (CtxItem *)this;
  local_18 = getItem<T5_d>(this);
  if (local_18->instancePtr == (void *)0x0) {
    if ((local_18->marker & 1U) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Cyclic dependecy while instantiating type: ",&local_59)
      ;
      std::type_info::name((type_info *)&T5_d::typeinfo);
      std::operator+(local_38,(char *)local_58);
      std::runtime_error::runtime_error(this_00,(string *)local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_18->marker = true;
    std::function<void_()>::operator()(&local_18->factory);
    local_18->marker = false;
  }
  return (T5_d *)local_18->instancePtr;
}

Assistant:

T& get()
    {
        CtxItem& item = getItem<T>(); // may return derived type

        if (item.instancePtr == nullptr)
        {
            if (item.marker)
                throw std::runtime_error(std::string("Cyclic dependecy while instantiating type: ") + typeid(T).name());

            item.marker = true;
            item.factory();
            item.marker = false;
        }

        return *(static_cast<T*>(item.instancePtr));
    }